

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall
QList<QAbstractItemModelPrivate::Change>::end(QList<QAbstractItemModelPrivate::Change> *this)

{
  Change *n;
  QArrayDataPointer<QAbstractItemModelPrivate::Change> *in_RDI;
  long in_FS_OFFSET;
  QArrayDataPointer<QAbstractItemModelPrivate::Change> *in_stack_ffffffffffffffe0;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QAbstractItemModelPrivate::Change> *)0x822af9);
  QArrayDataPointer<QAbstractItemModelPrivate::Change>::operator->(in_RDI);
  n = QArrayDataPointer<QAbstractItemModelPrivate::Change>::end(in_stack_ffffffffffffffe0);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator end() { detach(); return iterator(d->end()); }